

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_inet_socket_address.c
# Opt level: O3

void test_init_inet_socket_address_no_sock_addr(void)

{
  cio_error cVar1;
  uint8_t ipv4_address [4];
  cio_inet_address address;
  uint8_t local_20 [4];
  cio_inet_address local_1c;
  
  local_20[0] = 0xac;
  local_20[1] = '\x13';
  local_20[2] = '\x01';
  local_20[3] = '\x01';
  cVar1 = cio_init_inet_address(&local_1c,local_20,4);
  UnityAssertEqualNumber
            (0,(long)cVar1,"initialization of IPv4 inet address failed!",0x42,
             UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_init_inet_socket_address((cio_socket_address *)0x0,&local_1c,0xc);
  UnityAssertEqualNumber
            (-0x16,(long)cVar1,
             "initialization of inet socket address didn\'t fail when no socket address object given!"
             ,0x45,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_init_inet_socket_address_no_sock_addr(void)
{
	uint8_t ipv4_address[4] = {172, 19, 1, 1};
	struct cio_inet_address address;
	enum cio_error err = cio_init_inet_address(&address, ipv4_address, sizeof(ipv4_address));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "initialization of IPv4 inet address failed!");

	err = cio_init_inet_socket_address(NULL, &address, 12);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "initialization of inet socket address didn't fail when no socket address object given!");
}